

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_19(QPDF *pdf,char *arg2)

{
  pointer pQVar1;
  pointer pQVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  long lVar5;
  QPDFObjectHandle QVar6;
  allocator<char> local_c2;
  allocator<char> local_c1;
  value_type last;
  value_type newpage;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  string local_70 [32];
  string local_50 [32];
  
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,5);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&newpage,p_Var3);
  pQVar1 = (this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pQVar2 = (this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_80,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&newpage);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QPDF::addPage(QVar6,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&last,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish + -1));
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 != ((long)pQVar2 - (long)pQVar1 >> 4) + 1) {
    __assert_fail("pages.size() == count + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x33a,"void test_19(QPDF &, const char *)");
  }
  lVar4 = QPDFObjectHandle::getObjGen();
  lVar5 = QPDFObjectHandle::getObjGen();
  if (lVar4 != lVar5) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/Contents",&local_c1);
    QPDFObjectHandle::getKey(local_90);
    lVar4 = QPDFObjectHandle::getObjGen();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"/Contents",&local_c2);
    QPDFObjectHandle::getKey(local_a0);
    lVar5 = QPDFObjectHandle::getObjGen();
    if (lVar4 == lVar5) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
      std::__cxx11::string::~string(local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
      std::__cxx11::string::~string(local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&last.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newpage.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __assert_fail("last.getKey(\"/Contents\").getObjGen() == newpage.getKey(\"/Contents\").getObjGen()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x33c,"void test_19(QPDF &, const char *)");
  }
  __assert_fail("!(last.getObjGen() == newpage.getObjGen())",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x33b,"void test_19(QPDF &, const char *)");
}

Assistant:

static void
test_19(QPDF& pdf, char const* arg2)
{
    // Remove a page and re-insert it in the same file.
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();

    // Try to insert a page that's already there. A shallow copy
    // gets inserted instead.
    auto newpage = pages.at(5);
    size_t count = pages.size();
    pdf.addPage(newpage, false);
    auto last = pages.back();
    assert(pages.size() == count + 1);
    assert(!(last.getObjGen() == newpage.getObjGen()));
    assert(last.getKey("/Contents").getObjGen() == newpage.getKey("/Contents").getObjGen());
}